

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void check_throw_error<fmt::v5::system_error>(int error_code,FormatErrorMessage format)

{
  system_error *this;
  string_view message_00;
  int error_code_local;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  system_error error;
  memory_buffer message;
  
  fmt::v5::system_error::system_error<>(&error,0,(string_view)ZEXT816(0x1f94d9));
  this = (system_error *)__cxa_allocate_exception(0x18);
  message_00.size_ = 7;
  message_00.data_ = "test {}";
  fmt::v5::system_error::system_error<char[6]>(this,error_code,message_00,(char (*) [6])0x1e4d52);
  __cxa_throw(this,&fmt::v5::system_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_throw_error(int error_code, FormatErrorMessage format) {
  fmt::system_error error(0, "");
  try {
    throw Error(error_code, "test {}", "error");
  } catch (const fmt::system_error &e) {
    error = e;
  }
  fmt::memory_buffer message;
  format(message, error_code, "test error");
  EXPECT_EQ(to_string(message), error.what());
  EXPECT_EQ(error_code, error.error_code());
}